

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondStamp.hpp
# Opt level: O1

void __thiscall OpenMD::BondStamp::overrideType(BondStamp *this,string *type,RealType pars)

{
  iterator __position;
  double local_10;
  
  local_10 = pars;
  std::__cxx11::string::_M_assign((string *)&this->orType_);
  __position._M_current =
       (this->orPars_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->orPars_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&this->orPars_,__position,&local_10);
  }
  else {
    *__position._M_current = local_10;
    (this->orPars_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  this->hasOverride_ = true;
  return;
}

Assistant:

void overrideType(std::string type, RealType pars) {
      orType_ = type;
      orPars_.push_back(pars);
      hasOverride_ = true;
    }